

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.h
# Opt level: O0

void av1_set_high_precision_mv
               (AV1_COMP *cpi,int allow_high_precision_mv,int cur_frame_force_integer_mv)

{
  MvCosts *pMVar1;
  int **local_28;
  int copy_hp;
  MvCosts *mv_costs;
  int cur_frame_force_integer_mv_local;
  int allow_high_precision_mv_local;
  AV1_COMP *cpi_local;
  
  pMVar1 = (cpi->td).mb.mv_costs;
  if (pMVar1 != (MvCosts *)0x0) {
    (cpi->common).features.allow_high_precision_mv =
         allow_high_precision_mv != 0 && cur_frame_force_integer_mv == 0;
    pMVar1->nmv_cost[0] = pMVar1->nmv_cost_alloc[0] + 0x3fff;
    pMVar1->nmv_cost[1] = pMVar1->nmv_cost_alloc[1] + 0x3fff;
    pMVar1->nmv_cost_hp[0] = pMVar1->nmv_cost_hp_alloc[0] + 0x3fff;
    pMVar1->nmv_cost_hp[1] = pMVar1->nmv_cost_hp_alloc[1] + 0x3fff;
    if (allow_high_precision_mv != 0 && cur_frame_force_integer_mv == 0) {
      local_28 = pMVar1->nmv_cost_hp;
    }
    else {
      local_28 = pMVar1->nmv_cost;
    }
    pMVar1->mv_cost_stack = local_28;
  }
  return;
}

Assistant:

static inline void av1_set_high_precision_mv(AV1_COMP *cpi,
                                             int allow_high_precision_mv,
                                             int cur_frame_force_integer_mv) {
  MvCosts *const mv_costs = cpi->td.mb.mv_costs;
  // Avoid accessing 'mv_costs' when it is not allocated.
  if (mv_costs == NULL) return;

  const int copy_hp = cpi->common.features.allow_high_precision_mv =
      allow_high_precision_mv && !cur_frame_force_integer_mv;

  mv_costs->nmv_cost[0] = &mv_costs->nmv_cost_alloc[0][MV_MAX];
  mv_costs->nmv_cost[1] = &mv_costs->nmv_cost_alloc[1][MV_MAX];
  mv_costs->nmv_cost_hp[0] = &mv_costs->nmv_cost_hp_alloc[0][MV_MAX];
  mv_costs->nmv_cost_hp[1] = &mv_costs->nmv_cost_hp_alloc[1][MV_MAX];
  mv_costs->mv_cost_stack =
      copy_hp ? mv_costs->nmv_cost_hp : mv_costs->nmv_cost;
}